

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatbuffers_uoffset_t * lookup_ht(flatcc_builder_t *B,uint32_t hash)

{
  int iVar1;
  flatbuffers_uoffset_t *T;
  uint32_t hash_local;
  flatcc_builder_t *B_local;
  
  if ((B->ht_width == 0) && (iVar1 = alloc_ht(B), iVar1 != 0)) {
    B_local = (flatcc_builder_t *)0x0;
  }
  else {
    B_local = (flatcc_builder_t *)
              ((long)B->buffers[5].iov_base +
              (ulong)(hash >> (0x20U - (char)B->ht_width & 0x1f)) * 4);
  }
  return (flatbuffers_uoffset_t *)B_local;
}

Assistant:

static inline uoffset_t *lookup_ht(flatcc_builder_t *B, uint32_t hash)
{
    uoffset_t *T;

    if (B->ht_width == 0) {
        if (alloc_ht(B)) {
            return 0;
        }
    }
    T = B->buffers[flatcc_builder_alloc_ht].iov_base;

    return &T[FLATCC_BUILDER_BUCKET_VT_HASH(hash, B->ht_width)];
}